

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proitems.h
# Opt level: O0

ProString * __thiscall
ProString::operator=
          (ProString *this,
          QStringBuilder<QStringBuilder<const_char_(&)[2],_ProString_&>,_const_char_(&)[2]> *str)

{
  long lVar1;
  ProString *pPVar2;
  ProString *in_RDI;
  long in_FS_OFFSET;
  ProString *in_stack_ffffffffffffff78;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  ::QStringBuilder::operator_cast_to_QString
            ((QStringBuilder<QStringBuilder<const_char_(&)[2],_ProString_&>,_const_char_(&)[2]> *)
             in_stack_ffffffffffffff78);
  ProString(in_RDI,&in_stack_ffffffffffffff78->m_string);
  pPVar2 = operator=(in_RDI,in_stack_ffffffffffffff78);
  ~ProString((ProString *)0x1e8d86);
  QString::~QString((QString *)0x1e8d90);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return pPVar2;
  }
  __stack_chk_fail();
}

Assistant:

ProString &operator=(const QStringBuilder<A, B> &str)
    { return *this = QString(str); }